

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
__thiscall
duckdb::ParquetWritePrepareBatch
          (duckdb *this,ClientContext *context,FunctionData *bind_data,GlobalFunctionData *gstate,
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
          *collection)

{
  ParquetWriteBatchData *pPVar1;
  pointer this_00;
  type buffer;
  pointer pPVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParquetWriteBatchData_*,_false> local_28;
  
  pPVar1 = (ParquetWriteBatchData *)operator_new(0x80);
  (pPVar1->super_PreparedBatchData)._vptr_PreparedBatchData = (_func_int **)0x0;
  *(undefined8 *)&(pPVar1->prepared_row_group).row_group = 0;
  (pPVar1->prepared_row_group).row_group.columns.
  super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).row_group.columns.
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).row_group.columns.
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
   + 0x10) = (pointer)0x0;
  (pPVar1->prepared_row_group).row_group.total_byte_size = 0;
  (pPVar1->prepared_row_group).row_group.num_rows = 0;
  (pPVar1->prepared_row_group).row_group.sorting_columns.
  super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).row_group.sorting_columns.
           super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           .
           super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).row_group.sorting_columns.
           super_vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
           .
           super__Vector_base<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
   + 0x10) = (pointer)0x0;
  (pPVar1->prepared_row_group).row_group.file_offset = 0;
  (pPVar1->prepared_row_group).row_group.total_compressed_size = 0;
  (pPVar1->prepared_row_group).row_group.ordinal = 0;
  (pPVar1->prepared_row_group).row_group.__isset = (_RowGroup__isset)0x0;
  *(undefined5 *)&(pPVar1->prepared_row_group).row_group.field_0x5b = 0;
  (pPVar1->prepared_row_group).states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).states.
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).states.
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (pPVar1->super_PreparedBatchData)._vptr_PreparedBatchData =
       (_func_int **)&PTR__ParquetWriteBatchData_0247ab58;
  duckdb_parquet::RowGroup::RowGroup(&(pPVar1->prepared_row_group).row_group);
  (pPVar1->prepared_row_group).states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).states.
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pPVar1->prepared_row_group).states.
           super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
           ._M_impl + 0x10) = (pointer)0x0;
  local_28._M_head_impl = pPVar1;
  this_00 = unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::
            operator->((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                        *)(gstate + 1));
  buffer = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
           ::operator*(collection);
  pPVar2 = unique_ptr<duckdb::ParquetWriteBatchData,_std::default_delete<duckdb::ParquetWriteBatchData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetWriteBatchData,_std::default_delete<duckdb::ParquetWriteBatchData>,_true>
                         *)&local_28);
  ParquetWriter::PrepareRowGroup(this_00,buffer,&pPVar2->prepared_row_group);
  *(ParquetWriteBatchData **)this = local_28._M_head_impl;
  return (unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)
         (unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)
         this;
}

Assistant:

unique_ptr<PreparedBatchData> ParquetWritePrepareBatch(ClientContext &context, FunctionData &bind_data,
                                                       GlobalFunctionData &gstate,
                                                       unique_ptr<ColumnDataCollection> collection) {
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto result = make_uniq<ParquetWriteBatchData>();
	global_state.writer->PrepareRowGroup(*collection, result->prepared_row_group);
	return std::move(result);
}